

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O1

spv_result_t __thiscall
spvtools::val::Function::RegisterSelectionMerge(Function *this,uint32_t merge_id)

{
  bitset<7UL> *pbVar1;
  mapped_type pBVar2;
  mapped_type *block;
  mapped_type *ppBVar3;
  uint32_t local_6c;
  vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> local_68;
  Construct local_48;
  
  local_6c = merge_id;
  RegisterBlock(this,merge_id,false);
  block = std::__detail::
          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->blocks_,&local_6c);
  pBVar2 = this->current_block_;
  pbVar1 = &pBVar2->type_;
  (pbVar1->super__Base_bitset<1UL>)._M_w = (pbVar1->super__Base_bitset<1UL>)._M_w | 2;
  *(byte *)&(block->type_).super__Base_bitset<1UL>._M_w =
       (byte)(block->type_).super__Base_bitset<1UL>._M_w | 8;
  local_48._0_8_ = block;
  ppBVar3 = std::__detail::
            _Map_base<spvtools::val::BasicBlock_*,_std::pair<spvtools::val::BasicBlock_*const,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_spvtools::val::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::val::BasicBlock_*>,_std::hash<spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spvtools::val::BasicBlock_*,_std::pair<spvtools::val::BasicBlock_*const,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_spvtools::val::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::val::BasicBlock_*>,_std::hash<spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->merge_block_header_,(key_type *)&local_48);
  *ppBVar3 = pBVar2;
  BasicBlock::RegisterStructuralSuccessor(this->current_block_,block);
  local_68.
  super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Construct::Construct(&local_48,kSelection,this->current_block_,block,&local_68);
  AddConstruct(this,&local_48);
  if (local_48.corresponding_constructs_.
      super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.corresponding_constructs_.
                    super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.corresponding_constructs_.
                          super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.corresponding_constructs_.
                          super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.
      super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t Function::RegisterSelectionMerge(uint32_t merge_id) {
  RegisterBlock(merge_id, false);
  BasicBlock& merge_block = blocks_.at(merge_id);
  current_block_->set_type(kBlockTypeSelection);
  merge_block.set_type(kBlockTypeMerge);
  merge_block_header_[&merge_block] = current_block_;
  current_block_->RegisterStructuralSuccessor(&merge_block);

  AddConstruct({ConstructType::kSelection, current_block(), &merge_block});

  return SPV_SUCCESS;
}